

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,REF_LONG *global)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar3;
  int *piVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  REF_LONG global_ncell;
  REF_LONG *cell_global;
  long local_40;
  REF_LONG *local_38;
  
  ref_node = ref_grid->node;
  lVar9 = 0;
  iVar10 = 0;
  lVar11 = 0;
  do {
    ref_cell = ref_grid->cell[lVar9];
    uVar3 = ref_cell_global(ref_cell,ref_node,&local_38);
    if (uVar3 != 0) {
      pcVar8 = "cell global";
      uVar5 = 0x4ff;
LAB_0014abde:
      uVar7 = (ulong)uVar3;
LAB_0014ab7b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar5,
             "ref_grid_contiguous_cell_global",uVar7,pcVar8);
      return uVar3;
    }
    iVar1 = ref_cell->max;
    if (0 < (long)iVar1) {
      piVar4 = ref_cell->c2n;
      iVar2 = ref_cell->size_per;
      lVar6 = 0;
      do {
        if (*piVar4 != -1) {
          if (ref_cell->n <= lVar6) {
            if (local_38 != (REF_LONG *)0x0) {
              free(local_38);
            }
            pcVar8 = "pack grid before calling";
            uVar3 = 1;
            uVar5 = 0x503;
            uVar7 = 1;
            goto LAB_0014ab7b;
          }
          global[iVar10] = local_38[lVar6] + lVar11;
          iVar10 = iVar10 + 1;
        }
        lVar6 = lVar6 + 1;
        piVar4 = piVar4 + iVar2;
      } while (iVar1 != lVar6);
    }
    if (local_38 != (REF_LONG *)0x0) {
      free(local_38);
    }
    uVar3 = ref_cell_ncell(ref_cell,ref_node,&local_40);
    if (uVar3 != 0) {
      pcVar8 = "global ncell";
      uVar5 = 0x509;
      goto LAB_0014abde;
    }
    lVar11 = lVar11 + local_40;
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,
                                                   REF_LONG *global) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT group, ncell, cell;
  REF_CELL ref_cell;
  REF_LONG *cell_global, global_ncell, offset;
  ncell = 0;
  offset = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_global(ref_cell, ref_node, &cell_global), "cell global");
    each_ref_cell_valid_cell(ref_cell, cell) {
      if (cell >= ref_cell_n(ref_cell)) {
        ref_free(cell_global);
        RSS(REF_FAILURE, "pack grid before calling");
      }
      global[ncell] = cell_global[cell] + offset;
      ncell++;
    }
    ref_free(cell_global);
    RSS(ref_cell_ncell(ref_cell, ref_node, &global_ncell), "global ncell");
    offset += global_ncell;
  }
  return REF_SUCCESS;
}